

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O3

void __thiscall HEkkDual::majorUpdatePrimal(HEkkDual *this)

{
  __atomic_base<int> _Var1;
  bool bVar2;
  EdgeWeightMode EVar3;
  int iVar4;
  int iVar5;
  HVector *column;
  double *pdVar6;
  double *pdVar7;
  element_type *peVar8;
  HEkk *pHVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  HighsTask *pHVar13;
  HighsSplitDeque *pHVar14;
  long *plVar15;
  uint32_t uVar16;
  uint uVar17;
  ulong uVar18;
  MFinish *pMVar19;
  HighsInt iRow;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  HEkkDualRHS *this_00;
  HVector_ptr *ppHVar26;
  double *pdVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double new_pivotal_edge_weight;
  double Kai;
  double *dseArray;
  double *colArray;
  double *local_work_infeasibility;
  double *mixArray;
  TaskGroup local_d8;
  HEkkDualRHS *local_c8;
  MFinish *local_c0;
  vector<double,_std::allocator<double>_> *local_b8;
  pointer local_b0;
  anon_class_40_5_b11b0fa6 local_a8;
  double local_80;
  long *local_78;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [24];
  double local_40 [2];
  
  this_00 = &this->dualRHS;
  if ((this->dualRHS).workCount < 0) {
    local_58._0_8_ =
         (this->col_BFRT).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a8.edge_weight = (vector<double,_std::allocator<double>_> *)local_58;
    local_60 = (this->dualRHS).work_infeasibility.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_a8.new_pivotal_edge_weight = (double *)&local_60;
    uVar23 = (ulong)this->solver_num_row;
    local_c8 = this_00;
    local_a8.colArray = (double **)this;
    if ((long)uVar23 < 0x65) {
      if (0 < this->solver_num_row) {
        pdVar27 = this->baseValue;
        pdVar6 = this->baseLower;
        bVar2 = (this->ekk_instance_->info_).store_squared_primal_infeasibility;
        pdVar7 = this->baseUpper;
        uVar22 = 0;
        do {
          dVar29 = pdVar27[uVar22] - (double)(&((HEkk *)local_58._0_8_)->callback_)[uVar22];
          pdVar27[uVar22] = dVar29;
          dVar28 = pdVar6[uVar22] - dVar29;
          if (dVar28 <= this->Tp) {
            dVar29 = dVar29 - pdVar7[uVar22];
            dVar28 = (double)(-(ulong)(this->Tp < dVar29) & (ulong)dVar29);
          }
          if (bVar2 == false) {
            dVar28 = ABS(dVar28);
          }
          else {
            dVar28 = dVar28 * dVar28;
          }
          local_60[uVar22] = dVar28;
          uVar22 = uVar22 + 1;
        } while (uVar23 != uVar22);
      }
    }
    else {
      HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
      plVar15 = (long *)__tls_get_addr(&PTR_00441ef0);
      local_d8.workerDeque = (HighsSplitDeque *)*plVar15;
      local_d8.dequeHead = ((local_d8.workerDeque)->ownerData).head;
      do {
        pHVar14 = local_d8.workerDeque;
        uVar18 = uVar23 >> 1 & 0x7fffffff;
        uVar21 = ((local_d8.workerDeque)->ownerData).head;
        uVar22 = (ulong)uVar21;
        uVar17 = (uint)uVar23;
        if (uVar22 < 0x2000) {
          uVar16 = (uint32_t)(uVar22 + 1);
          ((local_d8.workerDeque)->ownerData).head = uVar16;
          ((local_d8.workerDeque)->taskArray)._M_elems[uVar22].metadata.stealer.
          super___atomic_base<unsigned_long>._M_i = 0;
          *(undefined ***)((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData =
               &PTR_operator___00441658;
          *(HighsInt *)(((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 8) =
               (HighsInt)uVar18;
          *(uint *)(((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 0xc) = uVar17;
          pHVar13 = ((local_d8.workerDeque)->taskArray)._M_elems + uVar22;
          pHVar13->taskData[0x10] = 'd';
          pHVar13->taskData[0x11] = '\0';
          pHVar13->taskData[0x12] = '\0';
          pHVar13->taskData[0x13] = '\0';
          *(anon_class_40_5_b11b0fa6 **)
           (((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 0x18) = &local_a8;
          if (((local_d8.workerDeque)->ownerData).allStolenCopy == true) {
            ((local_d8.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                 uVar22 << 0x20 | uVar22 + 1;
            ((local_d8.workerDeque)->stealerData).allStolen._M_base._M_i = false;
            ((local_d8.workerDeque)->ownerData).splitCopy = uVar16;
            ((local_d8.workerDeque)->ownerData).allStolenCopy = false;
            if ((((local_d8.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
              ((local_d8.workerDeque)->splitRequest)._M_base._M_i = false;
            }
            peVar8 = ((local_d8.workerDeque)->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            LOCK();
            _Var1._M_i = (peVar8->haveJobs).super___atomic_base<int>._M_i;
            (peVar8->haveJobs).super___atomic_base<int>._M_i =
                 (peVar8->haveJobs).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (_Var1._M_i < ((local_d8.workerDeque)->ownerData).numWorkers + -1) {
              HighsSplitDeque::WorkerBunk::publishWork
                        (((local_d8.workerDeque)->ownerData).workerBunk.
                         super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_d8.workerDeque);
            }
          }
          else {
            HighsSplitDeque::growShared(local_d8.workerDeque);
          }
        }
        else {
          if ((((local_d8.workerDeque)->ownerData).splitCopy < 0x2000) &&
             (((local_d8.workerDeque)->ownerData).allStolenCopy == false)) {
            HighsSplitDeque::growShared(local_d8.workerDeque);
            uVar21 = (pHVar14->ownerData).head;
          }
          (pHVar14->ownerData).head = uVar21 + 1;
          ::highs::parallel::for_each<HEkkDual::majorUpdatePrimal()::__0&>
                    ((HighsInt)uVar18,uVar17,(anon_class_24_3_f997d2ca *)&local_a8,100);
        }
        uVar23 = uVar18;
      } while (0xc9 < uVar17);
      if (1 < uVar17) {
        pdVar10 = ((local_a8.edge_weight)->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar27 = *(double **)((long)local_a8.colArray + 0x68);
        pdVar6 = *(double **)((long)local_a8.colArray + 0x58);
        bVar2 = ((*(HEkk **)((long)local_a8.colArray + 0x10))->info_).
                store_squared_primal_infeasibility;
        pdVar11 = (pointer)*local_a8.new_pivotal_edge_weight;
        uVar23 = 0;
        do {
          dVar29 = pdVar27[uVar23] - pdVar10[uVar23];
          pdVar27[uVar23] = dVar29;
          dVar28 = pdVar6[uVar23] - dVar29;
          if (dVar28 <= *(double *)((long)local_a8.colArray + 0xb8)) {
            dVar29 = dVar29 - (*(double **)((long)local_a8.colArray + 0x60))[uVar23];
            dVar28 = (double)(-(ulong)(*(double *)((long)local_a8.colArray + 0xb8) < dVar29) &
                             (ulong)dVar29);
          }
          if (bVar2 == false) {
            dVar28 = ABS(dVar28);
          }
          else {
            dVar28 = dVar28 * dVar28;
          }
          pdVar11[uVar23] = dVar28;
          uVar23 = uVar23 + 1;
        } while (uVar18 != uVar23);
      }
      ::highs::parallel::TaskGroup::taskWait(&local_d8);
      this_00 = local_c8;
      ::highs::parallel::TaskGroup::~TaskGroup(&local_d8);
    }
    if (((this->edge_weight_mode == kSteepestEdge) ||
        ((this->edge_weight_mode == kDevex && (this->new_devex_framework == false)))) &&
       (iVar20 = this->multi_nFinish, 0 < iVar20)) {
      local_b8 = &this->ekk_instance_->dual_edge_weight_;
      pMVar19 = this->multi_finish;
      local_78 = (long *)__tls_get_addr(&PTR_00441ef0);
      lVar24 = 0;
      local_c0 = pMVar19;
      do {
        local_b0 = (pointer)pMVar19[lVar24].EdWt;
        local_68 = ((pMVar19[lVar24].col_aq)->array).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (this->edge_weight_mode == kSteepestEdge) {
          local_70 = ((pMVar19[lVar24].row_ep)->array).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_80 = -2.0 / pMVar19[lVar24].alpha_row;
          uVar23 = (ulong)this->solver_num_row;
          local_a8.colArray = &local_68;
          local_a8.edge_weight = local_b8;
          local_a8.new_pivotal_edge_weight = (double *)&local_b0;
          local_a8.Kai = &local_80;
          local_a8.dseArray = &local_70;
          if ((long)uVar23 < 0x65) {
            pMVar19 = local_c0;
            this_00 = local_c8;
            if (0 < this->solver_num_row) {
              pdVar10 = (local_b8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              uVar22 = 0;
              do {
                dVar28 = ((double)local_b0 * local_68[uVar22] + local_80 * local_70[uVar22]) *
                         local_68[uVar22] + pdVar10[uVar22];
                if (dVar28 <= 0.0001) {
                  dVar28 = 0.0001;
                }
                pdVar10[uVar22] = dVar28;
                uVar22 = uVar22 + 1;
              } while (uVar23 != uVar22);
            }
          }
          else {
            HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
            local_d8.workerDeque = (HighsSplitDeque *)*local_78;
            local_d8.dequeHead = ((local_d8.workerDeque)->ownerData).head;
            do {
              pHVar14 = local_d8.workerDeque;
              uVar18 = uVar23 >> 1 & 0x7fffffff;
              uVar21 = ((local_d8.workerDeque)->ownerData).head;
              uVar22 = (ulong)uVar21;
              uVar17 = (uint)uVar23;
              if (uVar22 < 0x2000) {
                uVar16 = (uint32_t)(uVar22 + 1);
                ((local_d8.workerDeque)->ownerData).head = uVar16;
                ((local_d8.workerDeque)->taskArray)._M_elems[uVar22].metadata.stealer.
                super___atomic_base<unsigned_long>._M_i = 0;
                *(undefined ***)((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData =
                     &PTR_operator___004416b8;
                *(HighsInt *)(((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 8) =
                     (HighsInt)uVar18;
                *(uint *)(((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 0xc) =
                     uVar17;
                pHVar13 = ((local_d8.workerDeque)->taskArray)._M_elems + uVar22;
                pHVar13->taskData[0x10] = 'd';
                pHVar13->taskData[0x11] = '\0';
                pHVar13->taskData[0x12] = '\0';
                pHVar13->taskData[0x13] = '\0';
                *(anon_class_40_5_b11b0fa6 **)
                 (((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 0x18) = &local_a8;
                if (((local_d8.workerDeque)->ownerData).allStolenCopy == true) {
                  ((local_d8.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                       uVar22 << 0x20 | uVar22 + 1;
                  ((local_d8.workerDeque)->stealerData).allStolen._M_base._M_i = false;
                  ((local_d8.workerDeque)->ownerData).splitCopy = uVar16;
                  ((local_d8.workerDeque)->ownerData).allStolenCopy = false;
                  if ((((local_d8.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                    ((local_d8.workerDeque)->splitRequest)._M_base._M_i = false;
                  }
                  peVar8 = ((local_d8.workerDeque)->ownerData).workerBunk.
                           super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  LOCK();
                  _Var1._M_i = (peVar8->haveJobs).super___atomic_base<int>._M_i;
                  (peVar8->haveJobs).super___atomic_base<int>._M_i =
                       (peVar8->haveJobs).super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                  if (_Var1._M_i < ((local_d8.workerDeque)->ownerData).numWorkers + -1) {
                    HighsSplitDeque::WorkerBunk::publishWork
                              (((local_d8.workerDeque)->ownerData).workerBunk.
                               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,local_d8.workerDeque);
                  }
                }
                else {
                  HighsSplitDeque::growShared(local_d8.workerDeque);
                }
              }
              else {
                if ((((local_d8.workerDeque)->ownerData).splitCopy < 0x2000) &&
                   (((local_d8.workerDeque)->ownerData).allStolenCopy == false)) {
                  HighsSplitDeque::growShared(local_d8.workerDeque);
                  uVar21 = (pHVar14->ownerData).head;
                }
                (pHVar14->ownerData).head = uVar21 + 1;
                ::highs::parallel::for_each<HEkkDual::majorUpdatePrimal()::__1&>
                          ((HighsInt)uVar18,uVar17,&local_a8,100);
              }
              uVar23 = uVar18;
            } while (0xc9 < uVar17);
            if (1 < uVar17) {
              pdVar10 = *local_a8.colArray;
              pdVar11 = *local_a8.dseArray;
              pdVar12 = ((local_a8.edge_weight)->super__Vector_base<double,_std::allocator<double>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar23 = 0;
              do {
                dVar28 = ((double)*local_a8.new_pivotal_edge_weight * pdVar10[uVar23] +
                         *local_a8.Kai * pdVar11[uVar23]) * pdVar10[uVar23] + pdVar12[uVar23];
                if (dVar28 <= 0.0001) {
                  dVar28 = 0.0001;
                }
                pdVar12[uVar23] = dVar28;
                uVar23 = uVar23 + 1;
              } while (uVar18 != uVar23);
            }
            ::highs::parallel::TaskGroup::taskWait(&local_d8);
            ::highs::parallel::TaskGroup::~TaskGroup(&local_d8);
            iVar20 = this->multi_nFinish;
            pMVar19 = local_c0;
            this_00 = local_c8;
          }
        }
        else {
          iVar4 = this->solver_num_row;
          if (0 < (long)iVar4) {
            pdVar10 = (local_b8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar25 = 0;
            do {
              dVar29 = (double)local_b0 * local_68[lVar25] * local_68[lVar25];
              dVar28 = pdVar10[lVar25];
              if (dVar29 <= dVar28) {
                dVar29 = dVar28;
              }
              pdVar10[lVar25] = dVar29;
              lVar25 = lVar25 + 1;
            } while (iVar4 != lVar25);
          }
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < iVar20);
    }
    uVar21 = this->multi_nFinish;
LAB_00351540:
    if (0 < (int)uVar21) {
      pdVar27 = &this->multi_finish[0].basicValue;
      lVar24 = 0;
      do {
        HEkkDualRHS::updatePivots
                  (this_00,*(int *)(pdVar27 + -5),
                   (this->baseValue[*(int *)(pdVar27 + -5)] - pdVar27[-1]) + *pdVar27);
        lVar24 = lVar24 + 1;
        uVar21 = this->multi_nFinish;
        pdVar27 = pdVar27 + 0xf;
      } while (lVar24 < (int)uVar21);
    }
  }
  else {
    HEkkDualRHS::updatePrimal(this_00,&this->col_BFRT,1.0);
    HEkkDualRHS::updateInfeasList(this_00,&this->col_BFRT);
    uVar21 = this->multi_nFinish;
    if (0 < (int)uVar21) {
      ppHVar26 = &this->multi_finish[0].col_aq;
      lVar24 = 0;
      do {
        column = *ppHVar26;
        if (this->edge_weight_mode == kDevex) {
          if (this->new_devex_framework == false) {
            HEkk::updateDualDevexWeights(this->ekk_instance_,column,(double)ppHVar26[-2]);
          }
        }
        else if (this->edge_weight_mode == kSteepestEdge) {
          HEkk::updateDualSteepestEdgeWeights
                    (this->ekk_instance_,this->row_out,this->variable_in,column,(double)ppHVar26[-2]
                     ,-2.0 / (double)ppHVar26[-6],
                     (ppHVar26[-1]->array).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        }
        HEkkDualRHS::updateInfeasList(this_00,column);
        lVar24 = lVar24 + 1;
        uVar21 = this->multi_nFinish;
        ppHVar26 = ppHVar26 + 0xf;
      } while (lVar24 < (int)uVar21);
      goto LAB_00351540;
    }
  }
  EVar3 = this->edge_weight_mode;
  if (EVar3 == kDevex) {
    if (this->new_devex_framework != false) goto LAB_003516b4;
  }
  else if (EVar3 != kSteepestEdge) goto LAB_003516b4;
  if (0 < (int)uVar21) {
    pHVar9 = this->ekk_instance_;
    iVar20 = this->num_devex_iterations;
    lVar24 = 0;
    uVar23 = 0;
    do {
      iVar4 = this->multi_finish[uVar23].row_out;
      dVar28 = this->multi_finish[uVar23].EdWt;
      pdVar10 = ((this->multi_finish[uVar23].col_aq)->array).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (EVar3 == kSteepestEdge) {
        pdVar11 = (pHVar9->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (uVar23 != 0) {
          pdVar12 = ((this->multi_finish[uVar23].row_ep)->array).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar29 = this->multi_finish[uVar23].alpha_row;
          lVar25 = 0;
          do {
            iVar5 = *(int *)((long)&this->multi_finish[0].row_out + lVar25);
            dVar30 = pdVar10[iVar5];
            dVar30 = (dVar28 * dVar30 + pdVar12[iVar5] * (-2.0 / dVar29)) * dVar30 + pdVar11[iVar5];
            if (dVar30 <= 0.0001) {
              dVar30 = 0.0001;
            }
            pdVar11[iVar5] = dVar30;
            lVar25 = lVar25 + 0x78;
          } while (lVar24 != lVar25);
        }
        pdVar11[iVar4] = dVar28;
      }
      else {
        pdVar11 = (pHVar9->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (uVar23 != 0) {
          lVar25 = 0;
          do {
            iVar5 = *(int *)((long)&this->multi_finish[0].row_out + lVar25);
            dVar29 = pdVar10[iVar4];
            dVar29 = dVar28 * dVar29 * dVar29;
            if (dVar29 <= pdVar11[iVar5]) {
              dVar29 = pdVar11[iVar5];
            }
            pdVar11[iVar5] = dVar29;
            lVar25 = lVar25 + 0x78;
          } while (lVar24 != lVar25);
        }
        pdVar11[iVar4] = dVar28;
        iVar20 = iVar20 + 1;
        this->num_devex_iterations = iVar20;
      }
      uVar23 = uVar23 + 1;
      lVar24 = lVar24 + 0x78;
    } while (uVar23 != uVar21);
  }
LAB_003516b4:
  local_58._8_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 8),"999","");
  checkNonUnitWeightError(this,(string *)(local_58 + 8));
  if ((double *)local_58._8_8_ != local_40) {
    operator_delete((void *)local_58._8_8_);
  }
  return;
}

Assistant:

void HEkkDual::majorUpdatePrimal() {
  const bool updatePrimal_inDense = dualRHS.workCount < 0;
  if (updatePrimal_inDense) {
    // Dense update of primal values, infeasibility list and
    // non-pivotal edge weights
    const double* mixArray = col_BFRT.array.data();
    double* local_work_infeasibility = dualRHS.work_infeasibility.data();
    // #pragma omp parallel for schedule(static)
    highs::parallel::for_each(
        0, solver_num_row,
        [&](HighsInt start, HighsInt end) {
          for (HighsInt iRow = start; iRow < end; iRow++) {
            baseValue[iRow] -= mixArray[iRow];
            const double value = baseValue[iRow];
            const double less = baseLower[iRow] - value;
            const double more = value - baseUpper[iRow];
            double infeas = less > Tp ? less : (more > Tp ? more : 0);
            if (ekk_instance_.info_.store_squared_primal_infeasibility)
              local_work_infeasibility[iRow] = infeas * infeas;
            else
              local_work_infeasibility[iRow] = fabs(infeas);
          }
        },
        100);

    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge ||
        (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework)) {
      // Dense update of any edge weights (except weights for pivotal rows)
      std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
      for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
        // multi_finish[iFn].EdWt has already been transformed to correspond to
        // the new basis
        const double new_pivotal_edge_weight = multi_finish[iFn].EdWt;
        const double* colArray = multi_finish[iFn].col_aq->array.data();
        if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
          // Update steepest edge weights
          const double* dseArray = multi_finish[iFn].row_ep->array.data();
          const double Kai = -2 / multi_finish[iFn].alpha_row;
          // #pragma omp parallel for schedule(static)
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt iRow = start; iRow < end; iRow++) {
                  const double aa_iRow = colArray[iRow];
                  edge_weight[iRow] +=
                      aa_iRow * (new_pivotal_edge_weight * aa_iRow +
                                 Kai * dseArray[iRow]);
                  edge_weight[iRow] =
                      max(kMinDualSteepestEdgeWeight, edge_weight[iRow]);
                }
              },
              100);
        } else {
          // Update Devex weights
          for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
            const double aa_iRow = colArray[iRow];
            edge_weight[iRow] = max(
                edge_weight[iRow], new_pivotal_edge_weight * aa_iRow * aa_iRow);
          }
        }
      }
    }
  } else {
    // Sparse update of primal values, infeasibility list and
    // non-pivotal edge weights
    dualRHS.updatePrimal(&col_BFRT, 1);
    dualRHS.updateInfeasList(&col_BFRT);

    // Sparse update of any edge weights and infeasList. Weights for
    // rows pivotal in this set of MI are updated, but this is based
    // on the previous updated weights not the computed pivotal weight
    // that's known. For the rows pivotal in this set of MI, the
    // weights will be over-written in the next section of code.
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      MFinish* finish = &multi_finish[iFn];
      HVector* Col = finish->col_aq;
      const double new_pivotal_edge_weight = finish->EdWt;
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        // Update steepest edge weights
        HVector* Row = finish->row_ep;
        double Kai = -2 / finish->alpha_row;
        ekk_instance_.updateDualSteepestEdgeWeights(row_out, variable_in, Col,
                                                    new_pivotal_edge_weight,
                                                    Kai, Row->array.data());
      } else if (edge_weight_mode == EdgeWeightMode::kDevex &&
                 !new_devex_framework) {
        // Update Devex weights
        ekk_instance_.updateDualDevexWeights(Col, new_pivotal_edge_weight);
      }
      dualRHS.updateInfeasList(Col);
    }
  }

  // Update primal value for the rows pivotal in this set of MI
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HighsInt iRow = finish->row_out;
    double value = baseValue[iRow] - finish->basicBound + finish->basicValue;
    dualRHS.updatePivots(iRow, value);
  }

  // Update any edge weights for the rows pivotal in this set of MI.
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge ||
      (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework)) {
    // Update weights for the pivots using the computed values.
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      const HighsInt iRow = multi_finish[iFn].row_out;
      const double new_pivotal_edge_weight = multi_finish[iFn].EdWt;
      const double* colArray = multi_finish[iFn].col_aq->array.data();
      // The weight for this pivot is known, but weights for rows
      // pivotal earlier need to be updated
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        // Steepest edge
        const double* dseArray = multi_finish[iFn].row_ep->array.data();
        double Kai = -2 / multi_finish[iFn].alpha_row;
        for (HighsInt jFn = 0; jFn < iFn; jFn++) {
          HighsInt jRow = multi_finish[jFn].row_out;
          double value = colArray[jRow];
          edge_weight[jRow] +=
              value * (new_pivotal_edge_weight * value + Kai * dseArray[jRow]);
          edge_weight[jRow] =
              max(kMinDualSteepestEdgeWeight, edge_weight[jRow]);
        }
        edge_weight[iRow] = new_pivotal_edge_weight;
      } else {
        // Devex
        for (HighsInt jFn = 0; jFn < iFn; jFn++) {
          HighsInt jRow = multi_finish[jFn].row_out;
          const double aa_iRow = colArray[iRow];
          edge_weight[jRow] = max(edge_weight[jRow],
                                  new_pivotal_edge_weight * aa_iRow * aa_iRow);
        }
        edge_weight[iRow] = new_pivotal_edge_weight;
        num_devex_iterations++;
      }
    }
  }
  checkNonUnitWeightError("999");
}